

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

Image16Bit *
Image_Function::ConvertTo16Bit
          (Image *in,uint32_t startXIn,uint32_t startYIn,uint32_t width,uint32_t height)

{
  ImageTemplate<unsigned_char> *in_RSI;
  ImageTemplate<unsigned_short> *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  Image16Bit *out;
  uint8_t in_stack_ffffffffffffff86;
  uint8_t in_stack_ffffffffffffff87;
  ImageTemplate<unsigned_short> *this;
  uint32_t in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint8_t in_stack_ffffffffffffffae;
  uint8_t in_stack_ffffffffffffffaf;
  uint32_t in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb4;
  ImageTemplate<unsigned_short> *in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  Image16Bit *in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  uint32_t startXIn_00;
  uint32_t width_00;
  uint32_t height_00;
  ImageTemplate<unsigned_short> *pIVar1;
  
  this = in_RDI;
  pIVar1 = in_RDI;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c
             ,in_stack_ffffffffffffff98,(uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
  height_00 = (uint32_t)pIVar1;
  startXIn_00 = in_stack_ffffffffffffffdc & 0xffffff;
  PenguinV_Image::ImageTemplate<unsigned_short>::ImageTemplate
            (this,(uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,in_stack_ffffffffffffff87,
             in_stack_ffffffffffffff86);
  PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_RSI);
  width_00 = (uint32_t)in_RSI;
  PenguinV_Image::ImageTemplate<unsigned_short>::generate
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffaf,in_stack_ffffffffffffffae);
  PenguinV_Image::ImageTemplate<unsigned_short>::~ImageTemplate
            ((ImageTemplate<unsigned_short> *)0x11af8b);
  ConvertTo16Bit((Image *)CONCAT44(in_R8D,in_R9D),startXIn_00,in_stack_ffffffffffffffd8,
                 in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                 width_00,height_00);
  return this;
}

Assistant:

Image16Bit ConvertTo16Bit( const Image & in, uint32_t startXIn, uint32_t startYIn, uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, width, height );

        Image16Bit out = Image16Bit().generate( width, height, in.colorCount() );
        ConvertTo16Bit( in, startXIn, startYIn, out, 0, 0, width, height );

        return out;
    }